

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLogLog>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ushort uVar7;
  int iVar8;
  GetterXsYs<unsigned_short> *pGVar9;
  TransformerLogLog *pTVar10;
  ImPlotPlot *pIVar11;
  GetterXsYRef<unsigned_short> *pGVar12;
  ImDrawVert *pIVar13;
  uint *puVar14;
  ImVec2 IVar15;
  double dVar16;
  double dVar17;
  ImVec2 IVar18;
  ImPlotContext *pIVar19;
  ImPlotContext *pIVar20;
  uint uVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  
  pIVar19 = GImPlot;
  pGVar9 = this->Getter1;
  pTVar10 = this->Transformer;
  iVar8 = pGVar9->Count;
  lVar22 = (long)(((pGVar9->Offset + prim + 1) % iVar8 + iVar8) % iVar8) * (long)pGVar9->Stride;
  uVar7 = *(ushort *)((long)pGVar9->Ys + lVar22);
  dVar16 = log10((double)*(ushort *)((long)pGVar9->Xs + lVar22) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar19->LogDenX;
  pIVar11 = pIVar19->CurrentPlot;
  dVar4 = (pIVar11->XAxis).Range.Min;
  dVar5 = (pIVar11->XAxis).Range.Max;
  dVar17 = log10((double)uVar7 / pIVar11->YAxis[pTVar10->YAxis].Range.Min);
  pIVar20 = GImPlot;
  iVar8 = pTVar10->YAxis;
  pIVar11 = pIVar19->CurrentPlot;
  dVar6 = pIVar11->YAxis[iVar8].Range.Min;
  fVar26 = (float)((((double)(float)(dVar16 / dVar3) * (dVar5 - dVar4) + dVar4) -
                   (pIVar11->XAxis).Range.Min) * pIVar19->Mx +
                  (double)pIVar19->PixelRange[iVar8].Min.x);
  fVar24 = (float)((((double)(float)(dVar17 / pIVar19->LogDenY[iVar8]) *
                     (pIVar11->YAxis[iVar8].Range.Max - dVar6) + dVar6) - dVar6) *
                   pIVar19->My[iVar8] + (double)pIVar19->PixelRange[iVar8].Min.y);
  pGVar12 = this->Getter2;
  pTVar10 = this->Transformer;
  iVar8 = pGVar12->Count;
  dVar3 = pGVar12->YRef;
  dVar16 = log10((double)*(ushort *)
                          ((long)pGVar12->Xs +
                          (long)(((prim + 1 + pGVar12->Offset) % iVar8 + iVar8) % iVar8) *
                          (long)pGVar12->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar4 = pIVar20->LogDenX;
  pIVar11 = pIVar20->CurrentPlot;
  dVar5 = (pIVar11->XAxis).Range.Min;
  dVar6 = (pIVar11->XAxis).Range.Max;
  dVar17 = log10(dVar3 / pIVar11->YAxis[pTVar10->YAxis].Range.Min);
  iVar8 = pTVar10->YAxis;
  pIVar11 = pIVar20->CurrentPlot;
  dVar3 = pIVar11->YAxis[iVar8].Range.Min;
  fVar23 = (float)((((double)(float)(dVar16 / dVar4) * (dVar6 - dVar5) + dVar5) -
                   (pIVar11->XAxis).Range.Min) * pIVar20->Mx +
                  (double)pIVar20->PixelRange[iVar8].Min.x);
  fVar28 = (float)((((double)(float)(dVar17 / pIVar20->LogDenY[iVar8]) *
                     (pIVar11->YAxis[iVar8].Range.Max - dVar3) + dVar3) - dVar3) *
                   pIVar20->My[iVar8] + (double)pIVar20->PixelRange[iVar8].Min.y);
  fVar25 = (this->P12).x;
  fVar27 = fVar25 - fVar23;
  fVar30 = (this->P11).x;
  fVar1 = (this->P11).y;
  fVar2 = (this->P12).y;
  fVar31 = fVar30 * fVar24 - fVar26 * fVar1;
  fVar25 = fVar25 * fVar28 - fVar23 * fVar2;
  fVar30 = fVar30 - fVar26;
  fVar29 = fVar30 * (fVar2 - fVar28) - fVar27 * (fVar1 - fVar24);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar13 = DrawList->_VtxWritePtr;
  pIVar13->col = this->Col;
  pIVar13[1].pos.x = fVar26;
  pIVar13[1].pos.y = fVar24;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar13 = DrawList->_VtxWritePtr;
  pIVar13[1].col = this->Col;
  IVar18.y = ((fVar2 - fVar28) * fVar31 - (fVar1 - fVar24) * fVar25) / fVar29;
  IVar18.x = (fVar31 * fVar27 - fVar30 * fVar25) / fVar29;
  pIVar13[2].pos = IVar18;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar13 = DrawList->_VtxWritePtr;
  pIVar13[2].col = this->Col;
  pIVar13[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar13 = DrawList->_VtxWritePtr;
  pIVar13[3].col = this->Col;
  IVar15.y = fVar28;
  IVar15.x = fVar23;
  pIVar13[4].pos = IVar15;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar13 = DrawList->_VtxWritePtr;
  pIVar13[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar13 + 5;
  puVar14 = DrawList->_IdxWritePtr;
  *puVar14 = DrawList->_VtxCurrentIdx;
  uVar21 = -(uint)(fVar2 < fVar1 && fVar24 < fVar28 || fVar1 < fVar2 && fVar28 < fVar24) & 1;
  puVar14[1] = DrawList->_VtxCurrentIdx + uVar21 + 1;
  puVar14[2] = DrawList->_VtxCurrentIdx + 3;
  puVar14[3] = DrawList->_VtxCurrentIdx + 1;
  puVar14[4] = (uVar21 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar14[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar14 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar26;
  (this->P11).y = fVar24;
  (this->P12).x = fVar23;
  (this->P12).y = fVar28;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }